

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int fts5SnippetScore(Fts5ExtensionApi *pApi,Fts5Context *pFts,int nDocsize,uchar *aSeen,int iCol,
                    int iPos,int nToken,int *pnScore,int *piPos)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  int iVar8;
  long in_FS_OFFSET;
  int local_94;
  int nInst;
  int iOff;
  int ic;
  int ip;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  ip = 0;
  ic = 0;
  iOff = 0;
  nInst = -0x55555556;
  iVar2 = (*pApi->xInstCount)(pFts,&nInst);
  iVar4 = -1;
  iVar8 = 0;
  iVar5 = 0;
  local_94 = 0;
  while ((iVar8 < nInst && (iVar2 == 0))) {
    iVar2 = (*pApi->xInst)(pFts,iVar8,&ip,&ic,&iOff);
    iVar1 = iOff;
    if ((iVar2 == 0) &&
       (((ic == iCol && (iPos <= iOff)) && ((long)iOff < (long)iPos + (long)nToken)))) {
      iVar3 = iVar5 + 1;
      iVar5 = iVar5 + 1000;
      if (aSeen[ip] != '\0') {
        iVar5 = iVar3;
      }
      aSeen[ip] = '\x01';
      if (iVar4 < 0) {
        iVar4 = iOff;
      }
      local_94 = (*pApi->xPhraseSize)(pFts,ip);
      local_94 = local_94 + iVar1;
    }
    iVar8 = iVar8 + 1;
  }
  *pnScore = iVar5;
  if (piPos != (int *)0x0) {
    lVar6 = (long)(((iVar4 + nToken) - local_94) / -2 + iVar4);
    lVar7 = (long)(nDocsize - nToken);
    if (nToken + lVar6 <= (long)nDocsize) {
      lVar7 = lVar6;
    }
    iVar5 = 0;
    if (0 < lVar7) {
      iVar5 = (int)lVar7;
    }
    *piPos = iVar5;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return iVar2;
}

Assistant:

static int fts5SnippetScore(
  const Fts5ExtensionApi *pApi,   /* API offered by current FTS version */
  Fts5Context *pFts,              /* First arg to pass to pApi functions */
  int nDocsize,                   /* Size of column in tokens */
  unsigned char *aSeen,           /* Array with one element per query phrase */
  int iCol,                       /* Column to score */
  int iPos,                       /* Starting offset to score */
  int nToken,                     /* Max tokens per snippet */
  int *pnScore,                   /* OUT: Score */
  int *piPos                      /* OUT: Adjusted offset */
){
  int rc;
  int i;
  int ip = 0;
  int ic = 0;
  int iOff = 0;
  int iFirst = -1;
  int nInst;
  int nScore = 0;
  int iLast = 0;
  sqlite3_int64 iEnd = (sqlite3_int64)iPos + nToken;

  rc = pApi->xInstCount(pFts, &nInst);
  for(i=0; i<nInst && rc==SQLITE_OK; i++){
    rc = pApi->xInst(pFts, i, &ip, &ic, &iOff);
    if( rc==SQLITE_OK && ic==iCol && iOff>=iPos && iOff<iEnd ){
      nScore += (aSeen[ip] ? 1 : 1000);
      aSeen[ip] = 1;
      if( iFirst<0 ) iFirst = iOff;
      iLast = iOff + pApi->xPhraseSize(pFts, ip);
    }
  }

  *pnScore = nScore;
  if( piPos ){
    sqlite3_int64 iAdj = iFirst - (nToken - (iLast-iFirst)) / 2;
    if( (iAdj+nToken)>nDocsize ) iAdj = nDocsize - nToken;
    if( iAdj<0 ) iAdj = 0;
    *piPos = (int)iAdj;
  }

  return rc;
}